

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::insertNodeBetween
          (CollationBuilder *this,int32_t index,int32_t nextIndex,int64_t node,UErrorCode *errorCode
          )

{
  UBool UVar1;
  ulong uVar2;
  ulong uVar3;
  int64_t iVar4;
  int32_t newIndex;
  UErrorCode *errorCode_local;
  int64_t node_local;
  int32_t nextIndex_local;
  int32_t index_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_local._4_4_ = UVector64::size(&this->nodes);
    uVar2 = nodeFromPreviousIndex(index);
    uVar3 = nodeFromNextIndex(nextIndex);
    UVector64::addElement(&this->nodes,uVar2 | uVar3 | node,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      iVar4 = UVector64::elementAti(&this->nodes,index);
      iVar4 = changeNodeNextIndex(iVar4,this_local._4_4_);
      UVector64::setElementAt(&this->nodes,iVar4,index);
      if (nextIndex != 0) {
        iVar4 = UVector64::elementAti(&this->nodes,nextIndex);
        iVar4 = changeNodePreviousIndex(iVar4,this_local._4_4_);
        UVector64::setElementAt(&this->nodes,iVar4,nextIndex);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::insertNodeBetween(int32_t index, int32_t nextIndex, int64_t node,
                                    UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(previousIndexFromNode(node) == 0);
    U_ASSERT(nextIndexFromNode(node) == 0);
    U_ASSERT(nextIndexFromNode(nodes.elementAti(index)) == nextIndex);
    // Append the new node and link it to the existing nodes.
    int32_t newIndex = nodes.size();
    node |= nodeFromPreviousIndex(index) | nodeFromNextIndex(nextIndex);
    nodes.addElement(node, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    // nodes[index].nextIndex = newIndex
    node = nodes.elementAti(index);
    nodes.setElementAt(changeNodeNextIndex(node, newIndex), index);
    // nodes[nextIndex].previousIndex = newIndex
    if(nextIndex != 0) {
        node = nodes.elementAti(nextIndex);
        nodes.setElementAt(changeNodePreviousIndex(node, newIndex), nextIndex);
    }
    return newIndex;
}